

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instance.cpp
# Opt level: O1

void __thiscall
StringInstance::StringInstance
          (StringInstance *this,string *message_name,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *arguments)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  string *psVar2;
  bool bVar3;
  int iVar4;
  undefined8 *puVar5;
  char *pcVar6;
  string local_70;
  string local_50;
  
  paVar1 = &local_70.field_2;
  local_70._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"String","");
  Instance::Instance(&this->super_Instance,&local_70);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  (this->super_Instance)._vptr_Instance = (_func_int **)&PTR__StringInstance_0016de88;
  (this->_value)._M_dataplus._M_p = (pointer)&(this->_value).field_2;
  (this->_value)._M_string_length = 0;
  (this->_value).field_2._M_local_buf[0] = '\0';
  iVar4 = std::__cxx11::string::compare((char *)message_name);
  if ((iVar4 == 0) || (iVar4 = std::__cxx11::string::compare((char *)message_name), iVar4 == 0)) {
    psVar2 = (arguments->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    if ((long)(arguments->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_finish - (long)psVar2 == 0x20) {
      bVar3 = Grammar::is_variable(psVar2);
      if (bVar3) {
        std::__cxx11::string::_M_assign((string *)&(this->super_Instance)._name);
        std::__cxx11::string::_M_replace
                  ((ulong)&this->_value,0,(char *)(this->_value)._M_string_length,0x15b87f);
        return;
      }
      pcVar6 = "RuntimeError: invalid argument.";
      goto LAB_001466d4;
    }
  }
  else {
    iVar4 = std::__cxx11::string::compare((char *)message_name);
    if ((iVar4 != 0) && (iVar4 = std::__cxx11::string::compare((char *)message_name), iVar4 != 0)) {
      pcVar6 = "RuntimeError: invalid message.";
      goto LAB_001466d4;
    }
    psVar2 = (arguments->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    if ((long)(arguments->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_finish - (long)psVar2 == 0x40) {
      bVar3 = Grammar::is_variable(psVar2);
      pcVar6 = "RuntimeError: invalid argument.";
      if ((bVar3) &&
         (bVar3 = Grammar::is_string_value
                            ((arguments->
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             )._M_impl.super__Vector_impl_data._M_start + 1), bVar3)) {
        std::__cxx11::string::_M_assign((string *)&(this->super_Instance)._name);
        std::__cxx11::string::substr
                  ((ulong)&local_50,
                   (ulong)((arguments->
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_start + 1));
        str_utils::unescape(&local_70,&local_50,'\"');
        std::__cxx11::string::operator=((string *)&this->_value,(string *)&local_70);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._M_dataplus._M_p != paVar1) {
          operator_delete(local_70._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p == &local_50.field_2) {
          return;
        }
        operator_delete(local_50._M_dataplus._M_p);
        return;
      }
      goto LAB_001466d4;
    }
  }
  pcVar6 = "RuntimeError: wrong number of arguments.";
LAB_001466d4:
  puVar5 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar5 = pcVar6;
  __cxa_throw(puVar5,&char_const*::typeinfo,0);
}

Assistant:

StringInstance::StringInstance(const std::string& message_name, const std::vector<std::string>& arguments) :
    Instance("String") {
    if (message_name == "create:" || message_name == "createIfNotExists:") {
        if (arguments.size() != 1)
            throw EXC_WRONG_NUMBER_OF_ARGUMENTS;
        if (!Grammar::is_variable(arguments[0]))
            throw EXC_INVALID_ARGUMENT;
        _name = arguments[0];
        _value = "";
    }
    else if (message_name == "create:withValue:" || message_name == "createIfNotExists:withValue:") {
        if (arguments.size() != 2)
            throw EXC_WRONG_NUMBER_OF_ARGUMENTS;
        if (!Grammar::is_variable(arguments[0]) || !Grammar::is_string_value(arguments[1]))
            throw EXC_INVALID_ARGUMENT;
        _name = arguments[0];
        _value = str_utils::unescape(arguments[1].substr(1, int(arguments[1].size()) - 2), '"');
    }
    else
        throw EXC_INVALID_MESSAGE;
}